

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

int ascii_strncasecmp(char *LHS,char *RHS,size_t Length)

{
  byte bVar1;
  byte bVar2;
  uchar RHC;
  ulong uStack_30;
  uchar LHC;
  size_t I;
  size_t Length_local;
  char *RHS_local;
  char *LHS_local;
  
  uStack_30 = 0;
  while( true ) {
    if (Length <= uStack_30) {
      return 0;
    }
    bVar1 = llvm::toLower(LHS[uStack_30]);
    bVar2 = llvm::toLower(RHS[uStack_30]);
    if (bVar1 != bVar2) break;
    uStack_30 = uStack_30 + 1;
  }
  if (bVar2 <= bVar1) {
    return 1;
  }
  return -1;
}

Assistant:

static int ascii_strncasecmp(const char *LHS, const char *RHS, size_t Length) {
  for (size_t I = 0; I < Length; ++I) {
    unsigned char LHC = toLower(LHS[I]);
    unsigned char RHC = toLower(RHS[I]);
    if (LHC != RHC)
      return LHC < RHC ? -1 : 1;
  }
  return 0;
}